

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O0

int FindMTMessage(uchar *buf,int buflen,int addr,int mid,uchar **pFoundMsg,int *pFoundMsgTmpLen)

{
  int iVar1;
  int *pFoundMsgTmpLen_local;
  uchar **pFoundMsg_local;
  int mid_local;
  int addr_local;
  int buflen_local;
  uchar *buf_local;
  
  *pFoundMsg = buf;
  *pFoundMsgTmpLen = buflen;
  do {
    iVar1 = AnalyzeMTMessage(*pFoundMsg,*pFoundMsgTmpLen,addr,mid);
    if (iVar1 == 0) {
      return 0;
    }
    *pFoundMsg = *pFoundMsg + 1;
    *pFoundMsgTmpLen = *pFoundMsgTmpLen + -1;
  } while (4 < *pFoundMsgTmpLen);
  *pFoundMsg = (uchar *)0x0;
  *pFoundMsgTmpLen = 0;
  return 1;
}

Assistant:

inline int FindMTMessage(unsigned char* buf, int buflen, int addr, int mid, unsigned char** pFoundMsg, int* pFoundMsgTmpLen)
{
	*pFoundMsg = buf;
	*pFoundMsgTmpLen = buflen;

	while (AnalyzeMTMessage(*pFoundMsg, *pFoundMsgTmpLen, addr, mid) != EXIT_SUCCESS)
	{
		(*pFoundMsg)++;
		(*pFoundMsgTmpLen)--;
		if (*pFoundMsgTmpLen < MIN_STANDARD_BUF_LEN_MT)
		{
			*pFoundMsg = NULL;
			*pFoundMsgTmpLen = 0;
			return EXIT_FAILURE;
		}
	}

	return EXIT_SUCCESS;
}